

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

ByteArray *
ot::commissioner::internal::ExtractRouterIds(ByteArray *__return_storage_ptr__,ByteArray *aMask)

{
  pointer *ppuVar1;
  iterator __position;
  byte bVar2;
  undefined8 in_RAX;
  size_t i;
  ulong uVar3;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  uStack_28 = in_RAX;
  do {
    bVar2 = (byte)uVar3;
    if ((char)((aMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar3 >> 3] << (bVar2 & 7)) < '\0') {
      uStack_28 = CONCAT17(bVar2,(undefined7)uStack_28);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (__return_storage_ptr__,__position,(uchar *)((long)&uStack_28 + 7));
      }
      else {
        *__position._M_current = bVar2;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

ByteArray internal::ExtractRouterIds(const ByteArray &aMask)
{
    ByteArray routerIdList;

    for (size_t i = 0; i < kRouterIdMaskBytes * 8; i++)
    {
        if ((aMask[i / 8] & (0x80 >> (i % 8))) != 0)
        {
            routerIdList.push_back(i);
        }
    }

    return routerIdList;
}